

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::udiv(APInt *this,APInt *RHS)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  uint lhsWords;
  APInt AVar5;
  uint64_t uStack_40;
  
  uVar2 = RHS->BitWidth;
  if (uVar2 != in_RDX->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5fb,"APInt llvm::APInt::udiv(const APInt &) const");
  }
  if (uVar2 < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x5ff,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    uStack_40 = (RHS->U).VAL / (in_RDX->U).VAL;
  }
  else {
    uVar2 = getActiveBits(RHS);
    uVar3 = getActiveBits(in_RDX);
    if (uVar3 == 0) {
      __assert_fail("rhsWords && \"Divided by zero???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x607,"APInt llvm::APInt::udiv(const APInt &) const");
    }
    if (uVar2 != 0) {
      if (uVar3 == 1) {
        APInt(this,RHS);
        uVar4 = extraout_RDX;
        goto LAB_0019bb51;
      }
      lhsWords = (uint)((ulong)uVar2 + 0x3f >> 6);
      uVar3 = (uint)((ulong)uVar3 + 0x3f >> 6);
      if ((uVar3 <= lhsWords) && (bVar1 = ult(RHS,in_RDX), !bVar1)) {
        bVar1 = operator==(RHS,in_RDX);
        if (bVar1) {
          uVar2 = RHS->BitWidth;
          uStack_40 = 1;
        }
        else {
          uVar2 = RHS->BitWidth;
          if (lhsWords != 1) {
            APInt(this,uVar2,0,false);
            divide((RHS->U).pVal,lhsWords,(in_RDX->U).pVal,uVar3,(this->U).pVal,(WordType *)0x0);
            uVar4 = extraout_RDX_01;
            goto LAB_0019bb51;
          }
          uStack_40 = *(RHS->U).pVal / *(in_RDX->U).pVal;
        }
        goto LAB_0019bb4a;
      }
    }
    uVar2 = RHS->BitWidth;
    uStack_40 = 0;
  }
LAB_0019bb4a:
  APInt(this,uVar2,uStack_40,false);
  uVar4 = extraout_RDX_00;
LAB_0019bb51:
  AVar5._8_8_ = uVar4;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt APInt::udiv(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");

  // First, deal with the easy case
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    return APInt(BitWidth, U.VAL / RHS.U.VAL);
  }

  // Get some facts about the LHS and RHS number of bits and words
  unsigned lhsWords = getNumWords(getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Divided by zero???");

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X / 1 ===> X
    return *this;
  if (lhsWords < rhsWords || this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal, nullptr);
  return Quotient;
}